

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section_helper.hpp
# Opt level: O1

string * export_section<(pstore::repo::section_kind)2>
                   (string *__return_storage_ptr__,database *db,string_mapping *exported_strings,
                   section_content *content,bool comments)

{
  pointer pcVar1;
  string *psVar2;
  unique_ptr<const_pstore::repo::bss_section,_placement_delete<const_pstore::repo::bss_section>_>
  section;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ostringstream os;
  undefined8 local_90;
  void *local_88;
  size_t sStack_80;
  long local_78;
  not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> local_70;
  ostringstream local_68;
  
  local_70.ptr_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88;
  local_88 = (void *)0x0;
  sStack_80 = 0;
  local_78 = 0;
  pstore::gsl::not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>::
  ensure_invariant(&local_70);
  build_section<(pstore::repo::section_kind)2,pstore::repo::bss_section,pstore::repo::bss_section_creation_dispatcher>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
             (section_content *)local_70.ptr_);
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_68.super_ostream_base,0x1000);
  local_68.str_._M_dataplus._M_p = (pointer)&local_68.str_.field_2;
  local_68.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_00243498;
  local_68.str_._M_string_length = 0;
  local_68.str_.field_2._M_local_buf[0] = '\0';
  pstore::exchange::export_ns::operator()(&local_68,0,local_90);
  psVar2 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_68);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_68);
  if (local_88 != (void *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string export_section (pstore::database const & db,
                            pstore::exchange::export_ns::string_mapping const & exported_strings,
                            pstore::repo::section_content const & content, bool comments) {
    // First build the section that we want to export.
    std::vector<std::uint8_t> buffer;
    auto const section = build_section<Kind> (&buffer, content);

    // Now export it.
    using namespace pstore::exchange::export_ns;
    ostringstream os;
    emit_section<Kind> (os, indent{}, db, exported_strings, *section, comments);
    return os.str ();
}